

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall xLearn::Reader::Reader(Reader *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Reader_002665c0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  DMatrix::DMatrix((DMatrix *)this);
  *(undefined1 *)((long)in_RDI + 0x99) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 0x14));
  in_RDI[0x19] = 500;
  *(undefined4 *)(in_RDI + 0x1a) = 1;
  return;
}

Assistant:

Reader() : 
    shuffle_(false), 
    bin_out_(true),
    block_size_(kDefautBlockSize) {  }